

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O1

EGLConfig eglu::chooseSingleConfig(Library *egl,EGLDisplay display,FilterList *filters)

{
  bool bVar1;
  NotSupportedError *this;
  vector<void_*,_std::allocator<void_*>_> *pvVar2;
  pointer ppvVar3;
  bool bVar4;
  vector<void_*,_std::allocator<void_*>_> allConfigs;
  vector<void_*,_std::allocator<void_*>_> local_48;
  
  getConfigs(&local_48,egl,display);
  bVar4 = local_48.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_48.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_finish;
  ppvVar3 = local_48.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    pvVar2 = &local_48;
    if (bVar4) {
LAB_00179599:
      if (!bVar4) {
        if (local_48.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_48.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        return pvVar2;
      }
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this,"No matching EGL config found",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                 ,0x99);
      __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    bVar1 = FilterList::match(filters,egl,display,*ppvVar3);
    if (bVar1) {
      pvVar2 = (vector<void_*,_std::allocator<void_*>_> *)*ppvVar3;
      goto LAB_00179599;
    }
    ppvVar3 = ppvVar3 + 1;
    bVar4 = ppvVar3 ==
            local_48.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

EGLConfig chooseSingleConfig (const Library& egl, EGLDisplay display, const FilterList& filters)
{
	const vector<EGLConfig>	allConfigs	(getConfigs(egl, display));

	for (vector<EGLConfig>::const_iterator cfg = allConfigs.begin(); cfg != allConfigs.end(); ++cfg)
	{
		if (filters.match(egl, display, *cfg))
			return *cfg;
	}

	TCU_THROW(NotSupportedError, "No matching EGL config found");
}